

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestDiagnostic::Run(TestDiagnostic *this)

{
  Outputter **__u;
  bool bVar1;
  bool bVar2;
  int iVar3;
  pointer outputter;
  reference pvVar4;
  long lVar5;
  bool local_1719;
  string local_16e8 [39];
  byte local_16c1;
  string local_16c0 [38];
  allocator local_169a;
  allocator local_1699;
  RunParams local_1698;
  undefined1 local_1680 [8];
  Results rs;
  string local_1660 [32];
  undefined1 local_1640 [8];
  TestDiagnosticInternal myTestA;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> local_15f8;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> op;
  ostringstream local_15e0 [8];
  ostringstream oss;
  undefined1 local_1468 [8];
  TestRegistry r;
  TestDiagnostic *this_local;
  
  r._5192_8_ = this;
  testinator::TestRegistry::TestRegistry((TestRegistry *)local_1468);
  std::__cxx11::ostringstream::ostringstream(local_15e0);
  std::make_unique<testinator::DefaultOutputter,std::__cxx11::ostringstream&>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &myTestA.super_Test.m_op);
  __u = &myTestA.super_Test.m_op;
  std::unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>>::
  unique_ptr<testinator::DefaultOutputter,std::default_delete<testinator::DefaultOutputter>,void>
            ((unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>> *)
             &local_15f8,
             (unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
              *)__u);
  std::unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
  ::~unique_ptr((unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
                 *)__u);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1660,"A",
             (allocator *)
             ((long)&rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  TestDiagnosticInternal::TestDiagnosticInternal
            ((TestDiagnosticInternal *)local_1640,(TestRegistry *)local_1468,(string *)local_1660);
  std::__cxx11::string::~string(local_1660);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_1698.m_flags = 0;
  local_1698._4_4_ = 0;
  local_1698.m_numPropertyChecks = 0;
  local_1698.m_randomSeed = 0;
  testinator::RunParams::RunParams(&local_1698);
  outputter = std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::
              get(&local_15f8);
  testinator::TestRegistry::RunAllTests
            ((Results *)local_1680,(TestRegistry *)local_1468,&local_1698,outputter);
  if ((Run()::expected1_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&Run()::expected1_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)Run()::expected1_abi_cxx11_,"Hello world 42\n42",&local_1699);
    std::allocator<char>::~allocator((allocator<char> *)&local_1699);
    __cxa_atexit(std::__cxx11::string::~string,Run()::expected1_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&Run()::expected1_abi_cxx11_);
  }
  if ((Run()::expected2_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&Run()::expected2_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)Run()::expected2_abi_cxx11_,"Hello world 2a",&local_169a)
    ;
    std::allocator<char>::~allocator((allocator<char> *)&local_169a);
    __cxa_atexit(std::__cxx11::string::~string,Run()::expected2_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&Run()::expected2_abi_cxx11_);
  }
  bVar2 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::empty
                    ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_1680);
  local_16c1 = 0;
  bVar1 = false;
  local_1719 = false;
  if (!bVar2) {
    pvVar4 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::front
                       ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)
                        local_1680);
    local_1719 = false;
    if ((pvVar4->m_success & 1U) != 0) {
      std::__cxx11::ostringstream::str();
      local_16c1 = 1;
      lVar5 = std::__cxx11::string::find(local_16c0,0x2c6a80);
      local_1719 = false;
      if (lVar5 != -1) {
        std::__cxx11::ostringstream::str();
        bVar1 = true;
        lVar5 = std::__cxx11::string::find(local_16e8,0x2c6aa8);
        local_1719 = lVar5 != -1;
      }
    }
  }
  if (bVar1) {
    std::__cxx11::string::~string(local_16e8);
  }
  if ((local_16c1 & 1) != 0) {
    std::__cxx11::string::~string(local_16c0);
  }
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
            ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_1680);
  TestDiagnosticInternal::~TestDiagnosticInternal((TestDiagnosticInternal *)local_1640);
  std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::~unique_ptr
            (&local_15f8);
  std::__cxx11::ostringstream::~ostringstream(local_15e0);
  testinator::TestRegistry::~TestRegistry((TestRegistry *)local_1468);
  return local_1719;
}

Assistant:

virtual bool Run()
  {
    testinator::TestRegistry r;
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::DefaultOutputter>(oss);

    TestDiagnosticInternal myTestA(r, "A");
    testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());

    static string expected1 = "Hello world 42\n42";
    static string expected2 = "Hello world 2a";
    return !rs.empty() && rs.front().m_success
      && oss.str().find(expected1) != string::npos
      && oss.str().find(expected2) != string::npos;
  }